

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O2

void __thiscall
Js::LineOffsetCache::LineOffsetCache
          (LineOffsetCache *this,Recycler *allocator,charcount_t *lineCharacterOffsets,
          charcount_t *lineByteOffsets,int numberOfLines)

{
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar1;
  
  (this->lineCharacterOffsetCacheList).ptr =
       (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0;
  (this->lineByteOffsetCacheList).ptr =
       (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0;
  pRVar1 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::
           New<Memory::Recycler>(allocator,lineCharacterOffsets,numberOfLines);
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  WriteBarrierSet(&this->lineCharacterOffsetCacheList,pRVar1);
  if (lineByteOffsets != (charcount_t *)0x0) {
    pRVar1 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::
             New<Memory::Recycler>(allocator,lineByteOffsets,numberOfLines);
    Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
    ::WriteBarrierSet(&this->lineByteOffsetCacheList,pRVar1);
    return;
  }
  (this->lineByteOffsetCacheList).ptr =
       (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0;
  return;
}

Assistant:

LineOffsetCache::LineOffsetCache(Recycler *allocator,
        _In_reads_(numberOfLines) const charcount_t *lineCharacterOffsets,
        _In_reads_opt_(numberOfLines) const charcount_t *lineByteOffsets,
        __in int numberOfLines)
    {
        this->lineCharacterOffsetCacheList = LineOffsetCacheReadOnlyList::New(allocator, (charcount_t *)lineCharacterOffsets, numberOfLines);
        if (lineByteOffsets)
        {
            this->lineByteOffsetCacheList = LineOffsetCacheReadOnlyList::New(allocator, (charcount_t *)lineByteOffsets, numberOfLines);
        }
        else
        {
            this->lineByteOffsetCacheList = nullptr;
        }
    }